

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

bool google::protobuf::internal::anon_unknown_36::GetEnumValidationRange
               (EnumDescriptor *enum_type,int32_t *first,int32_t *last)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  Nonnull<const_char_*> extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar5;
  int32_t *extraout_RDX;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long v1;
  bool bVar13;
  LogMessageFatal local_150;
  unsigned_long local_140 [32];
  size_type local_40;
  unsigned_long *local_38;
  
  iVar12 = enum_type->value_count_;
  lVar9 = (long)iVar12;
  if (iVar12 + -1 == (int)enum_type->sequential_value_limit_) {
    if (iVar12 < 1) {
LAB_002786ff:
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,lVar9,"index < value_count()");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 != (Nonnull<const_char_*>)0x0) {
      _GLOBAL__N_1::GetEnumValidationRange();
      goto LAB_002787bd;
    }
    *first = enum_type->values_->number_;
    iVar12 = enum_type->value_count_;
    lVar9 = (long)iVar12 + -1;
    if ((long)iVar12 < 1) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,lVar9,"0 <= index");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      lVar9 = (long)(int)lVar9;
      if (enum_type->value_count_ < iVar12) {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar9,(long)enum_type->value_count_,"index < value_count()");
      }
      else {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        *last = enum_type->values_[lVar9].number_;
        return true;
      }
      goto LAB_002787d7;
    }
  }
  else {
    if (iVar12 < 1) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,lVar9,"index < value_count()");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      iVar12 = enum_type->values_->number_;
      iVar1 = enum_type->value_count_;
      iVar6 = iVar12;
      if (1 < (long)iVar1) {
        lVar9 = 1;
        lVar11 = 0x34;
        do {
          if (lVar9 < enum_type->value_count_) {
            pcVar4 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (lVar9,(long)enum_type->value_count_,"index < value_count()");
          }
          if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_00278780:
            _GLOBAL__N_1::GetEnumValidationRange();
            pcVar4 = extraout_RAX;
            goto LAB_0027878d;
          }
          iVar2 = *(int *)(&enum_type->values_->super_SymbolBaseN<0> + lVar11);
          if (iVar2 < iVar12) {
            iVar12 = iVar2;
          }
          if (lVar9 < enum_type->value_count_) {
            pcVar4 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (lVar9,(long)enum_type->value_count_,"index < value_count()");
          }
          if (pcVar4 != (Nonnull<const_char_*>)0x0) {
            _GLOBAL__N_1::GetEnumValidationRange();
            goto LAB_00278780;
          }
          iVar2 = *(int *)(&enum_type->values_->super_SymbolBaseN<0> + lVar11);
          if (iVar2 < iVar6) {
            iVar2 = iVar6;
          }
          iVar6 = iVar2;
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 0x30;
        } while (iVar1 != lVar9);
      }
      lVar11 = (long)iVar6 - (long)iVar12;
      if (lVar11 < enum_type->value_count_) {
        *first = iVar12;
        lVar9 = lVar11 + 0x7f;
        if (-1 < lVar11 + 0x40) {
          lVar9 = lVar11 + 0x40;
        }
        *last = iVar6;
        local_40 = lVar9 >> 6;
        if (local_40 < 0x21) {
          local_38 = local_140;
        }
        else {
          local_38 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                               ((new_allocator<unsigned_long> *)&local_40,local_40,(void *)0x0);
        }
        if (local_40 != 0) {
          memset(local_38,0,local_40 << 3);
        }
        iVar1 = enum_type->value_count_;
        uVar8 = 0;
        if (0 < (long)iVar1) {
          lVar10 = 4;
          v1 = 0;
          do {
            lVar9 = (long)enum_type->value_count_;
            if (v1 < lVar9) {
              pcVar4 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,lVar9,"index < value_count()");
            }
            if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_0027878d:
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_150,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xabb,pcVar4);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_150);
            }
            uVar3 = (long)*(int *)(&enum_type->values_->super_SymbolBaseN<0> + lVar10) -
                    (long)iVar12;
            uVar5 = uVar3 >> 6;
            if (local_40 <= uVar5) {
              _GLOBAL__N_1::GetEnumValidationRange();
              last = extraout_RDX;
              goto LAB_002786ff;
            }
            uVar7 = ((int)uVar8 + 1) - (uint)((local_38[uVar5] >> (uVar3 & 0x3f) & 1) != 0);
            uVar8 = (ulong)uVar7;
            local_38[uVar5] = local_38[uVar5] | 1L << (uVar3 & 0x3f);
            v1 = v1 + 1;
            lVar10 = lVar10 + 0x30;
          } while (iVar1 != v1);
          uVar8 = (ulong)uVar7;
        }
        bVar13 = lVar11 + 1U == uVar8;
        if (0x20 < local_40) {
          operator_delete(local_38,local_40 << 3);
        }
      }
      else {
        bVar13 = false;
      }
      return bVar13;
    }
LAB_002787bd:
    _GLOBAL__N_1::GetEnumValidationRange();
  }
  _GLOBAL__N_1::GetEnumValidationRange();
LAB_002787d7:
  _GLOBAL__N_1::GetEnumValidationRange();
  if (0x20 < local_40) {
    operator_delete(local_38,local_40 << 3);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int32_t& first,
                            int32_t& last) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, first, last);
  }

  first = enum_type->value(0)->number();
  last = enum_type->value(enum_type->value_count() - 1)->number();
  return true;
}